

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O3

double ON_EvaluateBernsteinBasis(int degree,int i,double t)

{
  double dVar1;
  double dVar2;
  
  if (degree < i || (i | degree) < 0) {
    return 0.0;
  }
  dVar1 = t;
  switch(degree) {
  case 0:
    t = 1.0;
    break;
  case 1:
    if (i == 0) {
      t = 1.0 - t;
    }
    break;
  case 2:
    if (i == 1) {
      return (t + t) * (1.0 - t);
    }
    if (i != 0) {
LAB_0045c86e:
      return t * t;
    }
    dVar1 = 1.0 - t;
LAB_0045c6a4:
    t = dVar1 * dVar1;
    break;
  case 3:
    if (i == 2) {
      dVar2 = (1.0 - t) * 3.0;
    }
    else {
      if (i == 1) {
        dVar2 = 3.0;
        goto LAB_0045c85c;
      }
      dVar2 = t;
      if (i == 0) {
        dVar1 = 1.0 - t;
        return dVar1 * dVar1 * dVar1;
      }
    }
    goto LAB_0045c83e;
  case 4:
    switch(i) {
    case 0:
      dVar1 = (1.0 - t) * (1.0 - t);
      goto LAB_0045c6a4;
    case 1:
      dVar2 = (1.0 - t) * 4.0;
LAB_0045c85c:
      dVar2 = dVar2 * (1.0 - t) * (1.0 - t);
      goto LAB_0045c864;
    case 2:
      dVar2 = (1.0 - t) * 6.0 * (1.0 - t);
      break;
    case 3:
      dVar2 = (1.0 - t) * 4.0 * t;
      break;
    default:
      t = t * t;
      goto LAB_0045c86e;
    }
LAB_0045c83e:
    dVar2 = dVar2 * t;
LAB_0045c864:
    t = dVar2 * dVar1;
    break;
  default:
    if (degree < 9) {
      dVar1 = ON_EvaluateBernsteinBasis(degree + -1,i + -1,t);
      dVar2 = ON_EvaluateBernsteinBasis(degree + -1,i,t);
      return dVar2 * (1.0 - t) + dVar1 * t;
    }
    dVar2 = ON_BinomialCoefficient(degree - i,i);
    if (degree - i != 0) {
      dVar1 = pow(1.0 - t,(double)(degree - i));
      dVar2 = dVar2 * dVar1;
      dVar1 = 1.0;
      if (i == 0) goto LAB_0045c864;
    }
    dVar1 = pow(t,(double)i);
    goto LAB_0045c864;
  }
  return t;
}

Assistant:

double ON_EvaluateBernsteinBasis(int degree, int i, double t)
/*****************************************************************************
Evaluate Bernstein basis polynomial

INPUT:
  degree
    If degree < 0, then 0.0 is returned.
  i
    If i < 0 or i > degree, then 0.0 is returned.
  t 
    The formula for the Bernstein polynomial is valid
    for all values of t.
OUTPUT:
  TL_EvBernsteinBasis()

         degree!
     ---------------- * (1-t)^(degree-i) * t^i, if 0 <= i <= degree
     (degree-i)! * i!

     0, otherwise.

  (In this function, 0^0 is treated as 1.)
COMMENTS:
  Below, B(d,i,t) is used to denote the i-th Bernstein basis polynomial of 
  degree d; i.e., B(d,i,t) = TL_EvBernsteinBasis(d,i,t).

  When degree <= 4, TL_EvBernsteinBasis() computes the value directly. 
  When 4 < degree < 9, the value is computed recursively using the formula

    B(d,i,t) = t*B(d-1,i-1,t) + (1-t)*B(d-1,i,t).

  For 9 <= degree, the value is computed using the formula

    B(d,i,t) = TL_EvBinomial(degree-i,i)
               *((degree==i) ? 1.0 : pow(1.0-t,(double)(degree-i)))
               *((i)         ? pow(t,(double)i) : 1.0);

  The value of a degree d Bezier at t with control vertices
  {P_0, ..., P_d} is equal to B(d,0,t)*P_0 + ... + B(d,d,t)*P_d.   
  Numerically, this formula is inefficient and unstable.  The
  de Casteljau algorithm used in TL_EvdeCasteljau() is faster
  and more stable.

EXAMPLE:
  // Use TL_EvBernsteinBasis() to evaluate a 3 dimensional
  // non-rational cubic Bezier at 1/4.

  double cv[4][3], t, B[4], answer[3];
  int    i, j, degree;

  degree = 3;
  t = 0.25;
  answer[0] = answer[1] = answer[2] = 0.0;
  for (i = 0; i <= degree; i++)
    cv[i] = something;
  for (i = 0; i <=degree; i++) {
    B[i] = TL_EvBernsteinBasis(degree,i,t);
    for (j = 0; j < 3; j++)
      answer[j] += B[i]*cv[i][j];
  }

REFERENCE:
  BOHM-01, Page 7.
RELATED FUNCTIONS:
  TL_EvNurbBasis
  TL_EvdeCasteljau()
  TL_EvBezier()
  TL_EvHorner()
*****************************************************************************/
{
  double
    s;
  if (degree < 0 || i < 0 || i > degree)
    return 0.0;
  switch(degree) {
  case 0:                       /* degree 0 */
    return 1.0;
  case 1:                       /* degree 1 */
    return ((i) ? t : 1.0-t);
  case 2:                       /* degree 2 */
    switch(i) {
    case 0:
      t = 1.0-t;
      return t*t;
    case 1:
      return 2.0*t*(1.0-t);
    default:                    /* i == 2 */
      return t*t;
    }
  case 3:                       /* degree 3 */
    switch(i) {
    case 0:
      t = 1.0 - t;
      return t*t*t;
    case 1:
      s = 1.0-t;
      return 3.0*s*s*t;
    case 2:
      return 3.0*(1.0-t)*t*t;
    default:                    /* i == 3 */
      return t*t*t;
    }
  case 4:                       /* degree 4 */
    switch(i) {
    case 0:
      t = 1.0-t;
      t = t*t;
      return t*t;
    case 1:                     /* 4*(1-t)^3*t */
      s = 1.0-t;
      return 4.0*s*s*s*t;
    case 2:                     /* 6*(1-t)^2*t */
      s = 1.0-t;
      return 6.0*s*s*t*t;
    case 3:                     /* 4*(1-t)*t^3 */
      return 4.0*(1.0-t)*t*t*t;
    default:                    /* t^4 (i == 4) */
      t = t*t;
      return t*t;
    }
  default:                      /* degree >= 5 */
    /* The "9" was determined to produce the fastest code when
     * tested on a SUN Sparc (SUNOS 4.3, gcc -O)
     */
    if (degree < 9)
      return (t*ON_EvaluateBernsteinBasis(degree-1,i-1,t)
              + (1-t)*ON_EvaluateBernsteinBasis(degree-1,i,t));
    else
      return ON_BinomialCoefficient(degree-i,i)*((degree==i)?1.0:pow(1.0-t,(double)(degree-i)))*((i)?pow(t,(double)i):1.0);
  }
}